

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

uint reed_solomon_find_error_locator(correct_reed_solomon *rs,size_t num_erasures)

{
  byte bVar1;
  field_logarithm_t *pfVar2;
  field_element_t *pfVar3;
  field_element_t *pfVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  field_element_t fVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  byte bVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  
  uVar9 = 0;
  memset((rs->error_locator).coeff,0,rs->min_distance + 1);
  *(rs->error_locator).coeff = '\x01';
  (rs->error_locator).order = 0;
  memcpy((rs->last_error_locator).coeff,(rs->error_locator).coeff,rs->min_distance + 1);
  uVar11 = (rs->error_locator).order;
  uVar7 = (ulong)uVar11;
  (rs->last_error_locator).order = uVar11;
  uVar6 = uVar11;
  if (uVar7 < rs->min_distance - num_erasures) {
    uVar21 = uVar11 - 1;
    bVar16 = 1;
    iVar15 = 1;
    uVar17 = uVar7;
    uVar10 = uVar11;
    do {
      uVar6 = (uint)uVar7;
      bVar18 = rs->syndromes[uVar17];
      if (uVar9 != 0) {
        uVar14 = 1;
        uVar22 = uVar21;
        do {
          uVar19 = (ulong)(rs->error_locator).coeff[uVar14];
          bVar20 = 0;
          if ((uVar19 != 0) && (bVar1 = rs->syndromes[uVar22], bVar1 != 0)) {
            pfVar2 = (rs->field).log;
            bVar20 = (rs->field).exp[(ulong)pfVar2[bVar1] + (ulong)pfVar2[uVar19]];
          }
          bVar18 = bVar18 ^ bVar20;
          uVar13 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar13;
          uVar22 = uVar22 - 1;
        } while (uVar13 <= uVar9);
      }
      uVar22 = (uint)uVar17;
      if (bVar18 == 0) {
        iVar15 = iVar15 + 1;
      }
      else if (uVar22 < uVar9 * 2) {
        if (-1 < (int)uVar10) {
          uVar7 = (ulong)uVar10;
          do {
            uVar17 = (ulong)(rs->last_error_locator).coeff[uVar7];
            bVar20 = 0;
            if ((uVar17 != 0) && (bVar20 = 0, bVar16 != 0)) {
              pfVar3 = (rs->field).exp;
              pfVar2 = (rs->field).log;
              bVar1 = pfVar3[(ulong)pfVar2[bVar18] + (ulong)pfVar2[uVar17]];
              if (bVar1 != 0) {
                bVar20 = pfVar3[((ulong)pfVar2[bVar1] - (ulong)pfVar2[bVar16]) + 0xff];
              }
            }
            pfVar3 = (rs->error_locator).coeff;
            uVar11 = iVar15 + (int)uVar7;
            pfVar3[uVar11] = bVar20 ^ pfVar3[uVar11];
            bVar5 = 0 < (long)uVar7;
            uVar7 = uVar7 - 1;
          } while (bVar5);
          uVar6 = (rs->error_locator).order;
          uVar11 = (rs->last_error_locator).order;
        }
        if (uVar6 < uVar11 + iVar15) {
          uVar6 = uVar11 + iVar15;
        }
        uVar7 = (ulong)uVar6;
        (rs->error_locator).order = uVar6;
        iVar15 = iVar15 + 1;
        uVar10 = uVar11;
      }
      else {
        if (-1 < (int)uVar10) {
          uVar7 = (ulong)uVar10;
          do {
            pfVar3 = (rs->last_error_locator).coeff;
            uVar17 = (ulong)pfVar3[uVar7];
            fVar12 = '\0';
            if ((uVar17 != 0) && (bVar16 != 0)) {
              pfVar4 = (rs->field).exp;
              pfVar2 = (rs->field).log;
              bVar20 = pfVar4[(ulong)pfVar2[bVar18] + (ulong)pfVar2[uVar17]];
              fVar12 = '\0';
              if (bVar20 != 0) {
                fVar12 = pfVar4[((ulong)pfVar2[bVar20] - (ulong)pfVar2[bVar16]) + 0xff];
              }
            }
            pfVar3[(uint)(iVar15 + (int)uVar7)] = fVar12;
            bVar5 = 0 < (long)uVar7;
            uVar7 = uVar7 - 1;
          } while (bVar5);
        }
        if (-1 < (int)(iVar15 - 1U)) {
          lVar8 = (ulong)(iVar15 - 1U) + 1;
          do {
            (rs->last_error_locator).coeff[lVar8 + -1] = '\0';
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        uVar17 = 0xffffffffffffffff;
        do {
          pfVar3 = (rs->error_locator).coeff;
          bVar16 = pfVar3[uVar17 + 1];
          pfVar3[uVar17 + 1] = (rs->last_error_locator).coeff[uVar17 + 1] ^ bVar16;
          (rs->last_error_locator).coeff[uVar17 + 1] = bVar16;
          uVar6 = (rs->last_error_locator).order + iVar15;
          uVar7 = (ulong)uVar6;
          uVar17 = uVar17 + 1;
        } while (uVar17 < uVar7);
        uVar11 = (rs->error_locator).order;
        (rs->error_locator).order = uVar6;
        (rs->last_error_locator).order = uVar11;
        uVar9 = (uVar22 - uVar9) + 1;
        iVar15 = 1;
        uVar10 = uVar11;
        bVar16 = bVar18;
      }
      uVar6 = (uint)uVar7;
      uVar17 = (ulong)(uVar22 + 1);
      uVar21 = uVar21 + 1;
    } while (uVar17 < rs->min_distance - num_erasures);
  }
  return uVar6;
}

Assistant:

static unsigned int reed_solomon_find_error_locator(correct_reed_solomon *rs, size_t num_erasures) {
    unsigned int numerrors = 0;

    memset(rs->error_locator.coeff, 0, (rs->min_distance + 1) * sizeof(field_element_t));

    // initialize to f(x) = 1
    rs->error_locator.coeff[0] = 1;
    rs->error_locator.order = 0;

    memcpy(rs->last_error_locator.coeff, rs->error_locator.coeff, (rs->min_distance + 1) * sizeof(field_element_t));
    rs->last_error_locator.order = rs->error_locator.order;

    field_element_t discrepancy;
    field_element_t last_discrepancy = 1;
    unsigned int delay_length = 1;

    for (unsigned int i = rs->error_locator.order; i < rs->min_distance - num_erasures; i++) {
        discrepancy = rs->syndromes[i];
        for (unsigned int j = 1; j <= numerrors; j++) {
            discrepancy = field_add(rs->field, discrepancy,
                                    field_mul(rs->field, rs->error_locator.coeff[j], rs->syndromes[i - j]));
        }

        if (!discrepancy) {
            // our existing LFSR describes the new syndrome as well
            // leave it as-is but update the number of delay elements
            //   so that if a discrepancy occurs later we can eliminate it
            delay_length++;
            continue;
        }

        if (2 * numerrors <= i) {
            // there's a discrepancy, but we still have room for more taps
            // lengthen LFSR by one tap and set weight to eliminate discrepancy

            // shift the last locator by the delay length, multiply by discrepancy,
            //   and divide by the last discrepancy
            // we move down because we're shifting up, and this prevents overwriting
            for (int j = rs->last_error_locator.order; j >= 0; j--) {
                // the bounds here will be ok since we have a headroom of numerrors
                rs->last_error_locator.coeff[j + delay_length] = field_div(
                    rs->field, field_mul(rs->field, rs->last_error_locator.coeff[j], discrepancy), last_discrepancy);
            }
            for (int j = delay_length - 1; j >= 0; j--) {
                rs->last_error_locator.coeff[j] = 0;
            }

            // locator = locator - last_locator
            // we will also update last_locator to be locator before this loop takes place
            field_element_t temp;
            for (int j = 0; j <= (rs->last_error_locator.order + delay_length); j++) {
                temp = rs->error_locator.coeff[j];
                rs->error_locator.coeff[j] =
                    field_add(rs->field, rs->error_locator.coeff[j], rs->last_error_locator.coeff[j]);
                rs->last_error_locator.coeff[j] = temp;
            }
            unsigned int temp_order = rs->error_locator.order;
            rs->error_locator.order = rs->last_error_locator.order + delay_length;
            rs->last_error_locator.order = temp_order;

            // now last_locator is locator before we started,
            //   and locator is (locator - (discrepancy/last_discrepancy) * x^(delay_length) * last_locator)

            numerrors = i + 1 - numerrors;
            last_discrepancy = discrepancy;
            delay_length = 1;
            continue;
        }

        // no more taps
        // unlike the previous case, we are preserving last locator,
        //    but we'll update locator as before
        // we're basically flattening the two loops from the previous case because
        //    we no longer need to update last_locator
        for (int j = rs->last_error_locator.order; j >= 0; j--) {
            rs->error_locator.coeff[j + delay_length] =
                field_add(rs->field, rs->error_locator.coeff[j + delay_length],
                          field_div(rs->field, field_mul(rs->field, rs->last_error_locator.coeff[j], discrepancy),
                                    last_discrepancy));
        }
        rs->error_locator.order = (rs->last_error_locator.order + delay_length > rs->error_locator.order)
                                      ? rs->last_error_locator.order + delay_length
                                      : rs->error_locator.order;
        delay_length++;
    }
    return rs->error_locator.order;
}